

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

void KDict_Reftrace(KonohaContext *kctx,KDict *dict,KObjectVisitor *visitor)

{
  ulong uVar1;
  undefined8 *in_RDX;
  ulong *in_RSI;
  size_t size;
  size_t i;
  ulong local_20;
  
  uVar1 = *in_RSI;
  local_20 = 0;
  do {
    if (uVar1 >> 4 <= local_20) {
      return;
    }
    if ((*(uint *)(in_RSI[1] + local_20 * 0x10 + 4) & 0x80000000) == 0x80000000) {
      if (*(long *)(in_RSI[1] + local_20 * 0x10 + 8) == 0) {
        __assert_fail("dict->data.keyValueItems[i].ObjectValue != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/konoha/import/klibexec.h"
                      ,0x143,"void KDict_Reftrace(KonohaContext *, KDict *, KObjectVisitor *)");
      }
      (*(code *)*in_RDX)(in_RDX,*(undefined8 *)(in_RSI[1] + local_20 * 0x10 + 8));
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

KLIBDECL void KDict_Reftrace(KonohaContext *kctx, KDict *dict, KObjectVisitor *visitor)
{
	size_t i, size = KDict_size(dict);
	for(i = 0; i < size; i++) {
		if(KTypeAttr_Is(Boxed, dict->data.keyValueItems[i].typeAttr)) {
			KRefTrace(dict->data.keyValueItems[i].ObjectValue);
		}
	}
}